

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O2

int get_tilemap_x(dbg_layer_t layer)

{
  _Bool _Var1;
  BGCNT_t *pBVar2;
  
  pBVar2 = get_bgcnt(layer);
  _Var1 = is_layer_affine(layer);
  if (!_Var1) {
    return *(int *)(&DAT_00124470 + (ulong)(pBVar2->raw >> 0xe) * 4);
  }
  fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
          "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/graphics/debug.c",
          0xe4);
  fwrite("aaa\n\x1b[0;m",9,1,_stderr);
  exit(1);
}

Assistant:

int get_tilemap_x(dbg_layer_t layer) {
    BGCNT_t* bgcnt = get_bgcnt(layer);
    if (is_layer_affine(layer)) {
        logfatal("aaa")
    } else {
        switch (bgcnt->screen_size) {
            case 0:
                return 256;
            case 1:
                return 512;
            case 2:
                return 256;
            case 3:
                return 512;
            default:
                logfatal("Invalid screen size: %d", bgcnt->screen_size)
        }
    }
}